

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O3

lzma_ret lzma2_encode(lzma_coder_conflict7 *coder,lzma_mf *mf,uint8_t *out,size_t *out_pos,
                     size_t out_size)

{
  uint8_t *in;
  size_t *in_pos;
  size_t *psVar1;
  size_t *out_pos_00;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  lzma_action lVar5;
  uint32_t limit;
  anon_enum_32 aVar6;
  uint uVar7;
  lzma_ret lVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong __n;
  
  uVar9 = *out_pos;
  if (uVar9 < out_size) {
    in = coder->buf;
    in_pos = &coder->buf_pos;
    psVar1 = &coder->uncompressed_size;
    out_pos_00 = &coder->compressed_size;
    aVar6 = coder->sequence;
    do {
      switch(aVar6) {
      case SEQ_INDICATOR:
        if ((mf->write_pos - mf->read_pos) + mf->read_ahead == 0) {
          lVar5 = mf->action;
          if (lVar5 == LZMA_FINISH) {
            *out_pos = uVar9 + 1;
            out[uVar9] = '\0';
          }
          return (uint)(lVar5 != LZMA_RUN);
        }
        if ((coder->need_state_reset == true) &&
           (lVar8 = lzma_lzma_encoder_reset((lzma_coder_conflict9 *)coder->lzma,&coder->opt_cur),
           lVar8 != LZMA_OK)) {
          return lVar8;
        }
        *psVar1 = 0;
        coder->compressed_size = 0;
        coder->sequence = SEQ_BLOCK_HEADER;
        uVar7 = 0x200000;
        break;
      case SEQ_BLOCK_HEADER:
        uVar7 = 0x200000 - (int)*psVar1;
        break;
      case SEQ_BLOCK:
        sVar10 = *out_pos_00;
        goto LAB_0045244c;
      case SEQ_CODER_INIT:
        lzma_bufcpy(in,in_pos,3,out,out_pos,out_size);
        if (*in_pos != 3) {
          return LZMA_OK;
        }
        coder->sequence = SEQ_CODE;
        uVar9 = *out_pos;
      case SEQ_CODE:
        if (mf->read_ahead != 0) {
          __assert_fail("mf->read_ahead == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                        ,0x11e,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
        }
        uVar11 = *psVar1;
        if (mf->read_pos < uVar11) {
          __assert_fail("mf->read_pos >= *left",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                        ,0x11f,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
        }
        uVar13 = out_size - uVar9;
        __n = uVar11;
        if (uVar13 < uVar11) {
          __n = uVar13;
        }
        memcpy(out + uVar9,mf->buffer + (mf->read_pos - uVar11),__n);
        *out_pos = uVar9 + __n;
        *psVar1 = uVar11 - __n;
        aVar6 = SEQ_INDICATOR;
        if (uVar13 < uVar11) {
          return LZMA_OK;
        }
        goto LAB_00452477;
      default:
        goto switchD_0045215f_default;
      }
      uVar3 = mf->read_pos;
      uVar4 = mf->read_ahead;
      limit = ((uVar7 + uVar3) - mf->match_len_max) - uVar4;
      if (uVar7 < mf->match_len_max) {
        limit = 0;
      }
      lVar8 = lzma_lzma_encode((lzma_coder_conflict9 *)coder->lzma,mf,coder->buf + 6,out_pos_00,
                               0x10000,limit);
      uVar7 = mf->read_ahead;
      uVar11 = (ulong)(((uVar4 + mf->read_pos) - uVar7) - uVar3) + coder->uncompressed_size;
      coder->uncompressed_size = uVar11;
      uVar9 = coder->compressed_size;
      if (0x10000 < uVar9) {
        __assert_fail("coder->compressed_size <= LZMA2_CHUNK_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,200,
                      "lzma_ret lzma2_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (0x200000 < uVar11) {
        __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,0xc9,
                      "lzma_ret lzma2_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (lVar8 != LZMA_STREAM_END) {
        return LZMA_OK;
      }
      if (uVar9 < uVar11) {
        if (uVar9 == 0) {
          __assert_fail("coder->compressed_size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0x3e,"void lzma2_header_lzma(lzma_coder *)");
        }
        _Var2 = coder->need_properties;
        if (_Var2 == true) {
          if (coder->need_dictionary_reset == true) {
            *in = 0xe0;
          }
          else {
            *in = 0xc0;
          }
          sVar10 = 0;
        }
        else {
          if (coder->need_state_reset == true) {
            coder->buf[1] = 0xa0;
          }
          else {
            coder->buf[1] = 0x80;
          }
          sVar10 = 1;
        }
        *in_pos = sVar10;
        lVar12 = uVar11 - 1;
        in[sVar10] = in[sVar10] + (char)((ulong)lVar12 >> 0x10);
        coder->buf[sVar10 + 1] = (uint8_t)((ulong)lVar12 >> 8);
        coder->buf[sVar10 + 2] = (uint8_t)lVar12;
        coder->buf[sVar10 + 3] = (uint8_t)(uVar9 - 1 >> 8);
        coder->buf[sVar10 + 4] = (uint8_t)(uVar9 - 1);
        if (_Var2 != false) {
          lzma_lzma_lclppb_encode(&coder->opt_cur,in + sVar10 + 5);
          uVar9 = *out_pos_00;
        }
        coder->need_properties = false;
        coder->need_state_reset = false;
        coder->need_dictionary_reset = false;
        sVar10 = uVar9 + 6;
        coder->compressed_size = sVar10;
        coder->sequence = SEQ_BLOCK;
LAB_0045244c:
        lzma_bufcpy(in,in_pos,sVar10,out,out_pos,out_size);
        aVar6 = SEQ_INDICATOR;
        if (*in_pos != *out_pos_00) {
          return LZMA_OK;
        }
      }
      else {
        uVar11 = uVar11 + uVar7;
        *psVar1 = uVar11;
        if (0x200000 < uVar11) {
          __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0xd4,
                        "lzma_ret lzma2_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        mf->read_ahead = 0;
        if (uVar11 == 0) {
          __assert_fail("coder->uncompressed_size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0x72,"void lzma2_header_uncompressed(lzma_coder *)");
        }
        if (0x10000 < uVar11) {
          __assert_fail("coder->uncompressed_size <= LZMA2_CHUNK_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0x73,"void lzma2_header_uncompressed(lzma_coder *)");
        }
        coder->buf[0] = '\x02' - coder->need_dictionary_reset;
        coder->buf[1] = (uint8_t)((uint)((int)uVar11 + -1) >> 8);
        coder->buf[2] = (char)uVar11 + 0xff;
        coder->buf_pos = 0;
        coder->need_state_reset = true;
        coder->need_dictionary_reset = false;
        aVar6 = SEQ_CODER_INIT;
      }
LAB_00452477:
      coder->sequence = aVar6;
switchD_0045215f_default:
      uVar9 = *out_pos;
    } while (uVar9 < out_size);
  }
  return LZMA_OK;
}

Assistant:

static lzma_ret
lzma2_encode(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint8_t *LZMA_RESTRICT out, size_t *LZMA_RESTRICT out_pos,
		size_t out_size)
{
	while (*out_pos < out_size)
	switch (coder->sequence) {
	case SEQ_INIT:
		// If there's no input left and we are flushing or finishing,
		// don't start a new chunk.
		if (mf_unencoded(mf) == 0) {
			// Write end of payload marker if finishing.
			if (mf->action == LZMA_FINISH)
				out[(*out_pos)++] = 0;

			return mf->action == LZMA_RUN
					? LZMA_OK : LZMA_STREAM_END;
		}

		if (coder->need_state_reset)
			return_if_error(lzma_lzma_encoder_reset(
					coder->lzma, &coder->opt_cur));

		coder->uncompressed_size = 0;
		coder->compressed_size = 0;
		coder->sequence = SEQ_LZMA_ENCODE;

	// Fall through

	case SEQ_LZMA_ENCODE: {
		uint32_t read_start;
		lzma_ret ret;

		// Calculate how much more uncompressed data this chunk
		// could accept.
		const uint32_t left = LZMA2_UNCOMPRESSED_MAX
				- coder->uncompressed_size;
		uint32_t limit;

		if (left < mf->match_len_max) {
			// Must flush immediately since the next LZMA symbol
			// could make the uncompressed size of the chunk too
			// big.
			limit = 0;
		} else {
			// Calculate maximum read_limit that is OK from point
			// of view of LZMA2 chunk size.
			limit = mf->read_pos - mf->read_ahead
					+ left - mf->match_len_max;
		}

		// Save the start position so that we can update
		// coder->uncompressed_size.
		read_start = mf->read_pos - mf->read_ahead;

		// Call the LZMA encoder until the chunk is finished.
		ret = lzma_lzma_encode(coder->lzma, mf,
				coder->buf + LZMA2_HEADER_MAX,
				&coder->compressed_size,
				LZMA2_CHUNK_MAX, limit);

		coder->uncompressed_size += mf->read_pos - mf->read_ahead
				- read_start;

		assert(coder->compressed_size <= LZMA2_CHUNK_MAX);
		assert(coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX);

		if (ret != LZMA_STREAM_END)
			return LZMA_OK;

		// See if the chunk compressed. If it didn't, we encode it
		// as uncompressed chunk. This saves a few bytes of space
		// and makes decoding faster.
		if (coder->compressed_size >= coder->uncompressed_size) {
			coder->uncompressed_size += mf->read_ahead;
			assert(coder->uncompressed_size
					<= LZMA2_UNCOMPRESSED_MAX);
			mf->read_ahead = 0;
			lzma2_header_uncompressed(coder);
			coder->need_state_reset = true;
			coder->sequence = SEQ_UNCOMPRESSED_HEADER;
			break;
		}

		// The chunk did compress at least by one byte, so we store
		// the chunk as LZMA.
		lzma2_header_lzma(coder);

		coder->sequence = SEQ_LZMA_COPY;
	}

	// Fall through

	case SEQ_LZMA_COPY:
		// Copy the compressed chunk along its headers to the
		// output buffer.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				coder->compressed_size,
				out, out_pos, out_size);
		if (coder->buf_pos != coder->compressed_size)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;

	case SEQ_UNCOMPRESSED_HEADER:
		// Copy the three-byte header to indicate uncompressed chunk.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				LZMA2_HEADER_UNCOMPRESSED,
				out, out_pos, out_size);
		if (coder->buf_pos != LZMA2_HEADER_UNCOMPRESSED)
			return LZMA_OK;

		coder->sequence = SEQ_UNCOMPRESSED_COPY;

	// Fall through

	case SEQ_UNCOMPRESSED_COPY:
		// Copy the uncompressed data as is from the dictionary
		// to the output buffer.
		mf_read(mf, out, out_pos, out_size, &coder->uncompressed_size);
		if (coder->uncompressed_size != 0)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;
	}

	return LZMA_OK;
}